

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::skip_spaces_and_empty_lines
          (parser_t<comments_skipper_t> *this)

{
  istream *piVar1;
  char cVar2;
  
  do {
    piVar1 = (this->input).m_backend;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) != 0) {
      return;
    }
    skip_spaces(this);
    cVar2 = input_stream_t::peek(&this->input);
    if (cVar2 == '#') {
      parse_comment(this);
    }
    else {
      cVar2 = input_stream_t::peek(&this->input);
      if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) {
        return;
      }
    }
    parse_new_line(this);
  } while( true );
}

Assistant:

void skip_spaces_and_empty_lines() {
        while (!input.eof()) {
            skip_spaces();

            if (input.peek() == '#') {
                parse_comment();
                parse_new_line();
            } else if (input.peek() == '\r' || input.peek() == '\n') {
                parse_new_line();
            } else {
                break;
            }
        }
    }